

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

bool __thiscall
QTreeWidget::dropMimeData
          (QTreeWidget *this,QTreeWidgetItem *parent,int index,QMimeData *data,DropAction action)

{
  long lVar1;
  byte bVar2;
  QAbstractItemModel *pQVar3;
  QTreeWidgetItem *in_RCX;
  int in_EDX;
  long in_RSI;
  int in_R8D;
  long in_FS_OFFSET;
  QModelIndex idx;
  undefined4 in_stack_ffffffffffffffa0;
  DropAction DVar4;
  undefined4 in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QModelIndex::QModelIndex((QModelIndex *)0x919636);
  if (in_RSI != 0) {
    indexFromItem((QTreeWidget *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0),in_RCX,in_R8D);
  }
  DVar4 = (DropAction)in_RCX;
  pQVar3 = QAbstractItemView::model((QAbstractItemView *)CONCAT44(in_R8D,in_stack_ffffffffffffffa0))
  ;
  bVar2 = QAbstractItemModel::dropMimeData
                    ((QMimeData *)pQVar3,DVar4,in_R8D,in_EDX,(QModelIndex *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeWidget::dropMimeData(QTreeWidgetItem *parent, int index,
                               const QMimeData *data, Qt::DropAction action)
{
    QModelIndex idx;
    if (parent) idx = indexFromItem(parent);
    return model()->QAbstractItemModel::dropMimeData(data, action , index, 0, idx);
}